

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void vdbeChangeP4Full(Vdbe *p,Op *pOp,char *zP4,int n)

{
  size_t sVar1;
  void *__dest;
  
  if (pOp->p4type != '\0') {
    freeP4(p->db,(int)pOp->p4type,(pOp->p4).p);
    pOp->p4type = '\0';
    (pOp->p4).p = (void *)0x0;
  }
  if (n < 0) {
    sqlite3VdbeChangeP4(p,(int)((ulong)((long)pOp - (long)p->aOp) >> 3) * -0x55555555,zP4,n);
    return;
  }
  if (n == 0) {
    if (zP4 != (char *)0x0) {
      sVar1 = strlen(zP4);
      sVar1 = (size_t)((uint)sVar1 & 0x3fffffff);
      goto LAB_00156d02;
    }
  }
  else if (zP4 != (char *)0x0) {
    sVar1 = (size_t)(uint)n;
LAB_00156d02:
    __dest = sqlite3DbMallocRawNN(p->db,sVar1 + 1);
    if (__dest != (void *)0x0) {
      memcpy(__dest,zP4,sVar1);
      *(undefined1 *)((long)__dest + sVar1) = 0;
      goto LAB_00156d2f;
    }
  }
  __dest = (void *)0x0;
LAB_00156d2f:
  (pOp->p4).p = __dest;
  pOp->p4type = -7;
  return;
}

Assistant:

static void SQLITE_NOINLINE vdbeChangeP4Full(
  Vdbe *p,
  Op *pOp,
  const char *zP4,
  int n
){
  if( pOp->p4type ){
    freeP4(p->db, pOp->p4type, pOp->p4.p);
    pOp->p4type = 0;
    pOp->p4.p = 0;
  }
  if( n<0 ){
    sqlite3VdbeChangeP4(p, (int)(pOp - p->aOp), zP4, n);
  }else{
    if( n==0 ) n = sqlite3Strlen30(zP4);
    pOp->p4.z = sqlite3DbStrNDup(p->db, zP4, n);
    pOp->p4type = P4_DYNAMIC;
  }
}